

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O0

QStringList * QInternalMimeData::formatsHelper(QMimeData *data)

{
  QLatin1StringView str;
  bool bVar1;
  parameter_type t;
  qsizetype qVar2;
  long *in_RSI;
  QListSpecialMethods<QString> *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  int i;
  QStringList *realFormats;
  QStringList imageFormats;
  QListSpecialMethods<QString> *in_stack_ffffffffffffff98;
  QListSpecialMethods<QString> *this;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  QList<QString> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(QString **)(in_RDI + 8) = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  (**(code **)(*in_RSI + 0x68))();
  QVar3 = Qt::Literals::StringLiterals::operator____L1((char *)this,(size_t)in_RDI);
  str.m_size._4_4_ = in_stack_ffffffffffffffb4;
  str.m_size._0_4_ = in_stack_ffffffffffffffb0;
  str.m_data = (char *)QVar3.m_size;
  bVar1 = QListSpecialMethods<QString>::contains(in_stack_ffffffffffffff98,str,CaseInsensitive);
  if (bVar1) {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    imageWriteMimeFormats();
    iVar4 = 0;
    while( true ) {
      t = (parameter_type)(long)iVar4;
      qVar2 = QList<QString>::size(&local_20);
      if (qVar2 <= (long)t) break;
      QList<QString>::at((QList<QString> *)in_RDI,(qsizetype)t);
      bVar1 = QListSpecialMethods<QString>::contains
                        (this,(QString *)in_RDI,(CaseSensitivity)((ulong)t >> 0x20));
      if (!bVar1) {
        QList<QString>::at((QList<QString> *)in_RDI,(qsizetype)t);
        QList<QString>::append((QList<QString> *)in_RDI,t);
      }
      iVar4 = iVar4 + 1;
    }
    QList<QString>::~QList((QList<QString> *)0x3a7bc9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QInternalMimeData::formatsHelper(const QMimeData *data)
{
    QStringList realFormats = data->formats();
    if (realFormats.contains("application/x-qt-image"_L1)) {
        // add all supported image formats
        QStringList imageFormats = imageWriteMimeFormats();
        for (int i = 0; i < imageFormats.size(); ++i) {
            if (!realFormats.contains(imageFormats.at(i)))
                realFormats.append(imageFormats.at(i));
        }
    }
    return realFormats;
}